

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.c
# Opt level: O3

void EncodeContextMap(MemoryManager *m,uint32_t *context_map,size_t context_map_size,
                     size_t num_clusters,HuffmanTree *tree,size_t *storage_ix,uint8_t *storage)

{
  byte bVar1;
  ulong uVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  uint uVar26;
  void *p;
  size_t sVar27;
  long lVar28;
  uint uVar29;
  ulong uVar30;
  ulong uVar31;
  uint uVar32;
  long lVar33;
  uint uVar34;
  int *piVar35;
  char cVar36;
  bool bVar37;
  int iVar48;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  int iVar49;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar50 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  int iVar70;
  undefined1 auVar68 [16];
  int iVar71;
  undefined1 auVar69 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  int iVar85;
  int iVar89;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  uint32_t histogram [272];
  uint8_t depths [272];
  uint16_t bits [272];
  long lVar51;
  
  StoreVarLenUint8(num_clusters - 1,storage_ix,storage);
  if (num_clusters == 1) {
    return;
  }
  p = BrotliAllocate(m,context_map_size * 4);
  uVar31 = (ulong)*context_map;
  if (1 < context_map_size) {
    sVar27 = 1;
    do {
      if ((uint)uVar31 < context_map[sVar27]) {
        uVar31 = (ulong)context_map[sVar27];
      }
      sVar27 = sVar27 + 1;
    } while (context_map_size != sVar27);
  }
  auVar38._8_4_ = (int)uVar31;
  auVar38._0_8_ = uVar31;
  auVar38._12_4_ = 0;
  uVar30 = 0;
  auVar39 = auVar38;
  auVar50 = _DAT_00178830;
  auVar52 = _DAT_00178840;
  auVar53 = _DAT_00178850;
  auVar54 = _DAT_00178860;
  auVar55 = _DAT_00177ff0;
  auVar56 = _DAT_00178000;
  auVar57 = _DAT_00176460;
  auVar58 = _DAT_00176470;
  do {
    auVar68 = auVar38 ^ _DAT_00176480;
    auVar72 = auVar58 ^ _DAT_00176480;
    iVar48 = auVar68._0_4_;
    iVar85 = -(uint)(iVar48 < auVar72._0_4_);
    iVar49 = auVar68._4_4_;
    auVar74._4_4_ = -(uint)(iVar49 < auVar72._4_4_);
    iVar70 = auVar68._8_4_;
    iVar89 = -(uint)(iVar70 < auVar72._8_4_);
    iVar71 = auVar68._12_4_;
    auVar74._12_4_ = -(uint)(iVar71 < auVar72._12_4_);
    auVar68._4_4_ = iVar85;
    auVar68._0_4_ = iVar85;
    auVar68._8_4_ = iVar89;
    auVar68._12_4_ = iVar89;
    auVar68 = pshuflw(auVar39,auVar68,0xe8);
    auVar73._4_4_ = -(uint)(auVar72._4_4_ == iVar49);
    auVar73._12_4_ = -(uint)(auVar72._12_4_ == iVar71);
    auVar73._0_4_ = auVar73._4_4_;
    auVar73._8_4_ = auVar73._12_4_;
    auVar59 = pshuflw(in_XMM11,auVar73,0xe8);
    auVar74._0_4_ = auVar74._4_4_;
    auVar74._8_4_ = auVar74._12_4_;
    auVar72 = pshuflw(auVar68,auVar74,0xe8);
    auVar39._8_4_ = 0xffffffff;
    auVar39._0_8_ = 0xffffffffffffffff;
    auVar39._12_4_ = 0xffffffff;
    auVar39 = (auVar72 | auVar59 & auVar68) ^ auVar39;
    auVar39 = packssdw(auVar39,auVar39);
    cVar36 = (char)uVar30;
    if ((auVar39 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      *(char *)((long)histogram + uVar30) = cVar36;
    }
    auVar59._4_4_ = iVar85;
    auVar59._0_4_ = iVar85;
    auVar59._8_4_ = iVar89;
    auVar59._12_4_ = iVar89;
    auVar74 = auVar73 & auVar59 | auVar74;
    auVar39 = packssdw(auVar74,auVar74);
    auVar72._8_4_ = 0xffffffff;
    auVar72._0_8_ = 0xffffffffffffffff;
    auVar72._12_4_ = 0xffffffff;
    auVar39 = packssdw(auVar39 ^ auVar72,auVar39 ^ auVar72);
    auVar39 = packsswb(auVar39,auVar39);
    if ((auVar39._0_4_ >> 8 & 1) != 0) {
      *(char *)((long)histogram + uVar30 + 1) = cVar36 + '\x01';
    }
    auVar39 = auVar57 ^ _DAT_00176480;
    auVar60._0_4_ = -(uint)(iVar48 < auVar39._0_4_);
    auVar60._4_4_ = -(uint)(iVar49 < auVar39._4_4_);
    auVar60._8_4_ = -(uint)(iVar70 < auVar39._8_4_);
    auVar60._12_4_ = -(uint)(iVar71 < auVar39._12_4_);
    auVar75._4_4_ = auVar60._0_4_;
    auVar75._0_4_ = auVar60._0_4_;
    auVar75._8_4_ = auVar60._8_4_;
    auVar75._12_4_ = auVar60._8_4_;
    iVar85 = -(uint)(auVar39._4_4_ == iVar49);
    iVar89 = -(uint)(auVar39._12_4_ == iVar71);
    auVar13._4_4_ = iVar85;
    auVar13._0_4_ = iVar85;
    auVar13._8_4_ = iVar89;
    auVar13._12_4_ = iVar89;
    auVar86._4_4_ = auVar60._4_4_;
    auVar86._0_4_ = auVar60._4_4_;
    auVar86._8_4_ = auVar60._12_4_;
    auVar86._12_4_ = auVar60._12_4_;
    auVar39 = auVar13 & auVar75 | auVar86;
    auVar39 = packssdw(auVar39,auVar39);
    auVar4._8_4_ = 0xffffffff;
    auVar4._0_8_ = 0xffffffffffffffff;
    auVar4._12_4_ = 0xffffffff;
    auVar39 = packssdw(auVar39 ^ auVar4,auVar39 ^ auVar4);
    auVar39 = packsswb(auVar39,auVar39);
    if ((auVar39._0_4_ >> 0x10 & 1) != 0) {
      *(char *)((long)histogram + uVar30 + 2) = cVar36 + '\x02';
    }
    auVar39 = pshufhw(auVar39,auVar75,0x84);
    auVar14._4_4_ = iVar85;
    auVar14._0_4_ = iVar85;
    auVar14._8_4_ = iVar89;
    auVar14._12_4_ = iVar89;
    auVar72 = pshufhw(auVar60,auVar14,0x84);
    auVar68 = pshufhw(auVar39,auVar86,0x84);
    auVar40._8_4_ = 0xffffffff;
    auVar40._0_8_ = 0xffffffffffffffff;
    auVar40._12_4_ = 0xffffffff;
    auVar40 = (auVar68 | auVar72 & auVar39) ^ auVar40;
    auVar39 = packssdw(auVar40,auVar40);
    auVar39 = packsswb(auVar39,auVar39);
    if ((auVar39._0_4_ >> 0x18 & 1) != 0) {
      *(char *)((long)histogram + uVar30 + 3) = cVar36 + '\x03';
    }
    auVar39 = auVar56 ^ _DAT_00176480;
    auVar61._0_4_ = -(uint)(iVar48 < auVar39._0_4_);
    auVar61._4_4_ = -(uint)(iVar49 < auVar39._4_4_);
    auVar61._8_4_ = -(uint)(iVar70 < auVar39._8_4_);
    auVar61._12_4_ = -(uint)(iVar71 < auVar39._12_4_);
    auVar15._4_4_ = auVar61._0_4_;
    auVar15._0_4_ = auVar61._0_4_;
    auVar15._8_4_ = auVar61._8_4_;
    auVar15._12_4_ = auVar61._8_4_;
    auVar72 = pshuflw(auVar86,auVar15,0xe8);
    auVar41._0_4_ = -(uint)(auVar39._0_4_ == iVar48);
    auVar41._4_4_ = -(uint)(auVar39._4_4_ == iVar49);
    auVar41._8_4_ = -(uint)(auVar39._8_4_ == iVar70);
    auVar41._12_4_ = -(uint)(auVar39._12_4_ == iVar71);
    auVar76._4_4_ = auVar41._4_4_;
    auVar76._0_4_ = auVar41._4_4_;
    auVar76._8_4_ = auVar41._12_4_;
    auVar76._12_4_ = auVar41._12_4_;
    auVar39 = pshuflw(auVar41,auVar76,0xe8);
    auVar77._4_4_ = auVar61._4_4_;
    auVar77._0_4_ = auVar61._4_4_;
    auVar77._8_4_ = auVar61._12_4_;
    auVar77._12_4_ = auVar61._12_4_;
    auVar68 = pshuflw(auVar61,auVar77,0xe8);
    auVar5._8_4_ = 0xffffffff;
    auVar5._0_8_ = 0xffffffffffffffff;
    auVar5._12_4_ = 0xffffffff;
    auVar39 = packssdw(auVar39 & auVar72,(auVar68 | auVar39 & auVar72) ^ auVar5);
    auVar39 = packsswb(auVar39,auVar39);
    if ((auVar39 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      *(char *)((long)histogram + uVar30 + 4) = cVar36 + '\x04';
    }
    auVar16._4_4_ = auVar61._0_4_;
    auVar16._0_4_ = auVar61._0_4_;
    auVar16._8_4_ = auVar61._8_4_;
    auVar16._12_4_ = auVar61._8_4_;
    auVar77 = auVar76 & auVar16 | auVar77;
    auVar68 = packssdw(auVar77,auVar77);
    auVar6._8_4_ = 0xffffffff;
    auVar6._0_8_ = 0xffffffffffffffff;
    auVar6._12_4_ = 0xffffffff;
    auVar39 = packssdw(auVar39,auVar68 ^ auVar6);
    auVar39 = packsswb(auVar39,auVar39);
    if ((auVar39._4_2_ >> 8 & 1) != 0) {
      *(char *)((long)histogram + uVar30 + 5) = cVar36 + '\x05';
    }
    auVar39 = auVar55 ^ _DAT_00176480;
    auVar62._0_4_ = -(uint)(iVar48 < auVar39._0_4_);
    auVar62._4_4_ = -(uint)(iVar49 < auVar39._4_4_);
    auVar62._8_4_ = -(uint)(iVar70 < auVar39._8_4_);
    auVar62._12_4_ = -(uint)(iVar71 < auVar39._12_4_);
    auVar78._4_4_ = auVar62._0_4_;
    auVar78._0_4_ = auVar62._0_4_;
    auVar78._8_4_ = auVar62._8_4_;
    auVar78._12_4_ = auVar62._8_4_;
    iVar85 = -(uint)(auVar39._4_4_ == iVar49);
    iVar89 = -(uint)(auVar39._12_4_ == iVar71);
    auVar17._4_4_ = iVar85;
    auVar17._0_4_ = iVar85;
    auVar17._8_4_ = iVar89;
    auVar17._12_4_ = iVar89;
    auVar87._4_4_ = auVar62._4_4_;
    auVar87._0_4_ = auVar62._4_4_;
    auVar87._8_4_ = auVar62._12_4_;
    auVar87._12_4_ = auVar62._12_4_;
    auVar39 = auVar17 & auVar78 | auVar87;
    auVar39 = packssdw(auVar39,auVar39);
    auVar7._8_4_ = 0xffffffff;
    auVar7._0_8_ = 0xffffffffffffffff;
    auVar7._12_4_ = 0xffffffff;
    auVar39 = packssdw(auVar39 ^ auVar7,auVar39 ^ auVar7);
    auVar39 = packsswb(auVar39,auVar39);
    if ((auVar39 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      *(char *)((long)histogram + uVar30 + 6) = cVar36 + '\x06';
    }
    auVar39 = pshufhw(auVar39,auVar78,0x84);
    auVar18._4_4_ = iVar85;
    auVar18._0_4_ = iVar85;
    auVar18._8_4_ = iVar89;
    auVar18._12_4_ = iVar89;
    auVar72 = pshufhw(auVar62,auVar18,0x84);
    auVar68 = pshufhw(auVar39,auVar87,0x84);
    auVar42._8_4_ = 0xffffffff;
    auVar42._0_8_ = 0xffffffffffffffff;
    auVar42._12_4_ = 0xffffffff;
    auVar42 = (auVar68 | auVar72 & auVar39) ^ auVar42;
    auVar39 = packssdw(auVar42,auVar42);
    auVar39 = packsswb(auVar39,auVar39);
    if ((auVar39._6_2_ >> 8 & 1) != 0) {
      *(char *)((long)histogram + uVar30 + 7) = cVar36 + '\a';
    }
    auVar39 = auVar54 ^ _DAT_00176480;
    auVar63._0_4_ = -(uint)(iVar48 < auVar39._0_4_);
    auVar63._4_4_ = -(uint)(iVar49 < auVar39._4_4_);
    auVar63._8_4_ = -(uint)(iVar70 < auVar39._8_4_);
    auVar63._12_4_ = -(uint)(iVar71 < auVar39._12_4_);
    auVar19._4_4_ = auVar63._0_4_;
    auVar19._0_4_ = auVar63._0_4_;
    auVar19._8_4_ = auVar63._8_4_;
    auVar19._12_4_ = auVar63._8_4_;
    auVar72 = pshuflw(auVar87,auVar19,0xe8);
    auVar43._0_4_ = -(uint)(auVar39._0_4_ == iVar48);
    auVar43._4_4_ = -(uint)(auVar39._4_4_ == iVar49);
    auVar43._8_4_ = -(uint)(auVar39._8_4_ == iVar70);
    auVar43._12_4_ = -(uint)(auVar39._12_4_ == iVar71);
    auVar79._4_4_ = auVar43._4_4_;
    auVar79._0_4_ = auVar43._4_4_;
    auVar79._8_4_ = auVar43._12_4_;
    auVar79._12_4_ = auVar43._12_4_;
    auVar39 = pshuflw(auVar43,auVar79,0xe8);
    auVar80._4_4_ = auVar63._4_4_;
    auVar80._0_4_ = auVar63._4_4_;
    auVar80._8_4_ = auVar63._12_4_;
    auVar80._12_4_ = auVar63._12_4_;
    auVar68 = pshuflw(auVar63,auVar80,0xe8);
    auVar64._8_4_ = 0xffffffff;
    auVar64._0_8_ = 0xffffffffffffffff;
    auVar64._12_4_ = 0xffffffff;
    auVar64 = (auVar68 | auVar39 & auVar72) ^ auVar64;
    auVar68 = packssdw(auVar64,auVar64);
    auVar39 = packsswb(auVar39 & auVar72,auVar68);
    if ((auVar39 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      *(char *)((long)histogram + uVar30 + 8) = cVar36 + '\b';
    }
    auVar20._4_4_ = auVar63._0_4_;
    auVar20._0_4_ = auVar63._0_4_;
    auVar20._8_4_ = auVar63._8_4_;
    auVar20._12_4_ = auVar63._8_4_;
    auVar80 = auVar79 & auVar20 | auVar80;
    auVar68 = packssdw(auVar80,auVar80);
    auVar8._8_4_ = 0xffffffff;
    auVar8._0_8_ = 0xffffffffffffffff;
    auVar8._12_4_ = 0xffffffff;
    auVar68 = packssdw(auVar68 ^ auVar8,auVar68 ^ auVar8);
    auVar39 = packsswb(auVar39,auVar68);
    if ((auVar39._8_2_ >> 8 & 1) != 0) {
      *(char *)((long)histogram + uVar30 + 9) = cVar36 + '\t';
    }
    auVar39 = auVar53 ^ _DAT_00176480;
    auVar65._0_4_ = -(uint)(iVar48 < auVar39._0_4_);
    auVar65._4_4_ = -(uint)(iVar49 < auVar39._4_4_);
    auVar65._8_4_ = -(uint)(iVar70 < auVar39._8_4_);
    auVar65._12_4_ = -(uint)(iVar71 < auVar39._12_4_);
    auVar81._4_4_ = auVar65._0_4_;
    auVar81._0_4_ = auVar65._0_4_;
    auVar81._8_4_ = auVar65._8_4_;
    auVar81._12_4_ = auVar65._8_4_;
    iVar85 = -(uint)(auVar39._4_4_ == iVar49);
    iVar89 = -(uint)(auVar39._12_4_ == iVar71);
    auVar21._4_4_ = iVar85;
    auVar21._0_4_ = iVar85;
    auVar21._8_4_ = iVar89;
    auVar21._12_4_ = iVar89;
    auVar88._4_4_ = auVar65._4_4_;
    auVar88._0_4_ = auVar65._4_4_;
    auVar88._8_4_ = auVar65._12_4_;
    auVar88._12_4_ = auVar65._12_4_;
    auVar39 = auVar21 & auVar81 | auVar88;
    auVar39 = packssdw(auVar39,auVar39);
    auVar9._8_4_ = 0xffffffff;
    auVar9._0_8_ = 0xffffffffffffffff;
    auVar9._12_4_ = 0xffffffff;
    auVar39 = packssdw(auVar39 ^ auVar9,auVar39 ^ auVar9);
    auVar39 = packsswb(auVar39,auVar39);
    if ((auVar39 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      *(char *)((long)histogram + uVar30 + 10) = cVar36 + '\n';
    }
    auVar39 = pshufhw(auVar39,auVar81,0x84);
    auVar22._4_4_ = iVar85;
    auVar22._0_4_ = iVar85;
    auVar22._8_4_ = iVar89;
    auVar22._12_4_ = iVar89;
    auVar72 = pshufhw(auVar65,auVar22,0x84);
    auVar68 = pshufhw(auVar39,auVar88,0x84);
    auVar44._8_4_ = 0xffffffff;
    auVar44._0_8_ = 0xffffffffffffffff;
    auVar44._12_4_ = 0xffffffff;
    auVar44 = (auVar68 | auVar72 & auVar39) ^ auVar44;
    auVar39 = packssdw(auVar44,auVar44);
    auVar39 = packsswb(auVar39,auVar39);
    if ((auVar39._10_2_ >> 8 & 1) != 0) {
      *(char *)((long)histogram + uVar30 + 0xb) = cVar36 + '\v';
    }
    auVar39 = auVar52 ^ _DAT_00176480;
    auVar66._0_4_ = -(uint)(iVar48 < auVar39._0_4_);
    auVar66._4_4_ = -(uint)(iVar49 < auVar39._4_4_);
    auVar66._8_4_ = -(uint)(iVar70 < auVar39._8_4_);
    auVar66._12_4_ = -(uint)(iVar71 < auVar39._12_4_);
    auVar23._4_4_ = auVar66._0_4_;
    auVar23._0_4_ = auVar66._0_4_;
    auVar23._8_4_ = auVar66._8_4_;
    auVar23._12_4_ = auVar66._8_4_;
    auVar72 = pshuflw(auVar88,auVar23,0xe8);
    auVar45._0_4_ = -(uint)(auVar39._0_4_ == iVar48);
    auVar45._4_4_ = -(uint)(auVar39._4_4_ == iVar49);
    auVar45._8_4_ = -(uint)(auVar39._8_4_ == iVar70);
    auVar45._12_4_ = -(uint)(auVar39._12_4_ == iVar71);
    auVar82._4_4_ = auVar45._4_4_;
    auVar82._0_4_ = auVar45._4_4_;
    auVar82._8_4_ = auVar45._12_4_;
    auVar82._12_4_ = auVar45._12_4_;
    auVar39 = pshuflw(auVar45,auVar82,0xe8);
    auVar83._4_4_ = auVar66._4_4_;
    auVar83._0_4_ = auVar66._4_4_;
    auVar83._8_4_ = auVar66._12_4_;
    auVar83._12_4_ = auVar66._12_4_;
    auVar68 = pshuflw(auVar66,auVar83,0xe8);
    auVar10._8_4_ = 0xffffffff;
    auVar10._0_8_ = 0xffffffffffffffff;
    auVar10._12_4_ = 0xffffffff;
    auVar39 = packssdw(auVar39 & auVar72,(auVar68 | auVar39 & auVar72) ^ auVar10);
    auVar39 = packsswb(auVar39,auVar39);
    if ((auVar39 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      *(char *)((long)histogram + uVar30 + 0xc) = cVar36 + '\f';
    }
    auVar24._4_4_ = auVar66._0_4_;
    auVar24._0_4_ = auVar66._0_4_;
    auVar24._8_4_ = auVar66._8_4_;
    auVar24._12_4_ = auVar66._8_4_;
    auVar83 = auVar82 & auVar24 | auVar83;
    auVar68 = packssdw(auVar83,auVar83);
    auVar11._8_4_ = 0xffffffff;
    auVar11._0_8_ = 0xffffffffffffffff;
    auVar11._12_4_ = 0xffffffff;
    auVar39 = packssdw(auVar39,auVar68 ^ auVar11);
    auVar39 = packsswb(auVar39,auVar39);
    if ((auVar39._12_2_ >> 8 & 1) != 0) {
      *(char *)((long)histogram + uVar30 + 0xd) = cVar36 + '\r';
    }
    auVar39 = auVar50 ^ _DAT_00176480;
    auVar67._0_4_ = -(uint)(iVar48 < auVar39._0_4_);
    auVar67._4_4_ = -(uint)(iVar49 < auVar39._4_4_);
    auVar67._8_4_ = -(uint)(iVar70 < auVar39._8_4_);
    auVar67._12_4_ = -(uint)(iVar71 < auVar39._12_4_);
    auVar84._4_4_ = auVar67._0_4_;
    auVar84._0_4_ = auVar67._0_4_;
    auVar84._8_4_ = auVar67._8_4_;
    auVar84._12_4_ = auVar67._8_4_;
    iVar48 = -(uint)(auVar39._4_4_ == iVar49);
    iVar49 = -(uint)(auVar39._12_4_ == iVar71);
    auVar69._4_4_ = iVar48;
    auVar69._0_4_ = iVar48;
    auVar69._8_4_ = iVar49;
    auVar69._12_4_ = iVar49;
    auVar46._4_4_ = auVar67._4_4_;
    auVar46._0_4_ = auVar67._4_4_;
    auVar46._8_4_ = auVar67._12_4_;
    auVar46._12_4_ = auVar67._12_4_;
    auVar46 = auVar69 & auVar84 | auVar46;
    auVar39 = packssdw(auVar46,auVar46);
    auVar12._8_4_ = 0xffffffff;
    auVar12._0_8_ = 0xffffffffffffffff;
    auVar12._12_4_ = 0xffffffff;
    auVar39 = packssdw(auVar39 ^ auVar12,auVar39 ^ auVar12);
    auVar39 = packsswb(auVar39,auVar39);
    if ((auVar39 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      *(char *)((long)histogram + uVar30 + 0xe) = cVar36 + '\x0e';
    }
    auVar39 = pshufhw(auVar39,auVar84,0x84);
    in_XMM11 = pshufhw(auVar67,auVar69,0x84);
    in_XMM11 = in_XMM11 & auVar39;
    auVar25._4_4_ = auVar67._4_4_;
    auVar25._0_4_ = auVar67._4_4_;
    auVar25._8_4_ = auVar67._12_4_;
    auVar25._12_4_ = auVar67._12_4_;
    auVar39 = pshufhw(auVar39,auVar25,0x84);
    auVar47._8_4_ = 0xffffffff;
    auVar47._0_8_ = 0xffffffffffffffff;
    auVar47._12_4_ = 0xffffffff;
    auVar47 = (auVar39 | in_XMM11) ^ auVar47;
    auVar39 = packssdw(auVar47,auVar47);
    auVar39 = packsswb(auVar39,auVar39);
    if ((auVar39._14_2_ >> 8 & 1) != 0) {
      *(char *)((long)histogram + uVar30 + 0xf) = cVar36 + '\x0f';
    }
    uVar30 = uVar30 + 0x10;
    lVar33 = (long)DAT_00178870;
    lVar51 = auVar58._8_8_;
    auVar58._0_8_ = auVar58._0_8_ + lVar33;
    lVar28 = DAT_00178870._8_8_;
    auVar58._8_8_ = lVar51 + lVar28;
    lVar51 = auVar57._8_8_;
    auVar57._0_8_ = auVar57._0_8_ + lVar33;
    auVar57._8_8_ = lVar51 + lVar28;
    lVar51 = auVar56._8_8_;
    auVar56._0_8_ = auVar56._0_8_ + lVar33;
    auVar56._8_8_ = lVar51 + lVar28;
    lVar51 = auVar55._8_8_;
    auVar55._0_8_ = auVar55._0_8_ + lVar33;
    auVar55._8_8_ = lVar51 + lVar28;
    lVar51 = auVar54._8_8_;
    auVar54._0_8_ = auVar54._0_8_ + lVar33;
    auVar54._8_8_ = lVar51 + lVar28;
    lVar51 = auVar53._8_8_;
    auVar53._0_8_ = auVar53._0_8_ + lVar33;
    auVar53._8_8_ = lVar51 + lVar28;
    lVar51 = auVar52._8_8_;
    auVar52._0_8_ = auVar52._0_8_ + lVar33;
    auVar52._8_8_ = lVar51 + lVar28;
    lVar51 = auVar50._8_8_;
    auVar50._0_8_ = auVar50._0_8_ + lVar33;
    auVar50._8_8_ = lVar51 + lVar28;
    auVar39 = _DAT_00178870;
  } while ((uVar31 + 0x10 & 0xfffffffffffffff0) != uVar30);
  if (context_map_size != 0) {
    uVar32 = (int)uVar31 + 1;
    uVar31 = (ulong)uVar32;
    sVar27 = 0;
    do {
      if (uVar32 == 0) {
        *(undefined4 *)((long)p + sVar27 * 4) = 0;
        cVar36 = (char)histogram[0];
      }
      else {
        cVar36 = (char)context_map[sVar27];
        uVar30 = 0;
        do {
          if (*(char *)((long)histogram + uVar30) == cVar36) {
            *(int *)((long)p + sVar27 * 4) = (int)uVar30;
            if (uVar30 != 0) goto LAB_0012b83d;
            goto LAB_0012b84c;
          }
          uVar30 = uVar30 + 1;
        } while (uVar31 != uVar30);
        *(uint *)((long)p + sVar27 * 4) = uVar32;
        cVar36 = *(char *)((long)histogram + uVar31);
        uVar30 = uVar31;
LAB_0012b83d:
        memmove((void *)((long)histogram + 1),histogram,uVar30);
      }
LAB_0012b84c:
      histogram[0]._0_1_ = cVar36;
      sVar27 = sVar27 + 1;
    } while (sVar27 != context_map_size);
    uVar32 = 0;
    uVar31 = 0;
    do {
      uVar30 = uVar31 + 1;
      if (uVar31 + 1 < context_map_size) {
        uVar30 = context_map_size;
      }
      piVar35 = (int *)((long)p + uVar31 * 4);
      while (*(int *)((long)p + uVar31 * 4) != 0) {
        uVar31 = uVar31 + 1;
        piVar35 = piVar35 + 1;
        if (uVar30 == uVar31) {
          uVar29 = 0;
          goto LAB_0012b8c1;
        }
      }
      uVar29 = 0;
      if (uVar31 < context_map_size) {
        lVar33 = 0;
        while (*piVar35 == 0) {
          lVar33 = lVar33 + -1;
          piVar35 = piVar35 + 1;
          if (uVar31 - context_map_size == lVar33) {
            uVar29 = (int)context_map_size - (int)uVar31;
LAB_0012b8c1:
            if (uVar32 < uVar29) {
              uVar32 = uVar29;
            }
            goto LAB_0012b8c6;
          }
        }
        uVar31 = uVar31 - lVar33;
        uVar29 = -(int)lVar33;
      }
      if (uVar32 < uVar29) {
        uVar32 = uVar29;
      }
    } while (uVar31 < context_map_size);
LAB_0012b8c6:
    if (uVar32 != 0) {
      uVar29 = 0x1f;
      if (uVar32 != 0) {
        for (; uVar32 >> uVar29 == 0; uVar29 = uVar29 - 1) {
        }
      }
      goto LAB_0012b8d1;
    }
  }
  uVar29 = 0;
LAB_0012b8d1:
  uVar31 = 6;
  if (uVar29 < 6) {
    uVar31 = (ulong)uVar29;
  }
  uVar32 = (uint)uVar31;
  if (context_map_size == 0) {
    lVar33 = 0;
    memset(histogram,0,0x440);
    bVar37 = true;
  }
  else {
    uVar26 = 2 << ((byte)uVar31 & 0x1f);
    lVar33 = 0;
    uVar30 = 0;
    do {
      iVar48 = *(int *)((long)p + uVar30 * 4);
      if (iVar48 == 0) {
        uVar34 = 1;
        uVar2 = uVar30 + 1;
        if (context_map_size <= uVar30 + 1) {
LAB_0012b965:
          uVar30 = uVar2;
          if (uVar26 <= uVar34) goto code_r0x0012b969;
          uVar3 = 0x1f;
          if (uVar34 != 0) {
            for (; uVar34 >> uVar3 == 0; uVar3 = uVar3 - 1) {
            }
          }
          *(uint *)((long)p + lVar33 * 4) = ((-1 << ((byte)uVar3 & 0x1f)) + uVar34) * 0x200 | uVar3;
          goto LAB_0012b916;
        }
        uVar34 = (int)context_map_size - (int)uVar30;
        lVar28 = 1;
        do {
          if (*(int *)((long)p + lVar28 * 4 + uVar30 * 4) != 0) {
            uVar34 = (uint)lVar28;
            break;
          }
          lVar28 = lVar28 + 1;
        } while (context_map_size - uVar30 != lVar28);
        uVar30 = uVar30 + uVar34;
        uVar2 = uVar30;
        if (uVar34 != 0) goto LAB_0012b965;
      }
      else {
        *(uint *)((long)p + lVar33 * 4) = iVar48 + uVar32;
        uVar30 = uVar30 + 1;
LAB_0012b916:
        lVar33 = lVar33 + 1;
      }
LAB_0012b919:
    } while (uVar30 < context_map_size);
    memset(histogram,0,0x440);
    bVar37 = lVar33 == 0;
    if (bVar37) {
      bVar37 = true;
      lVar33 = 0;
    }
    else {
      lVar28 = 0;
      do {
        histogram[*(uint *)((long)p + lVar28 * 4) & 0x1ff] =
             histogram[*(uint *)((long)p + lVar28 * 4) & 0x1ff] + 1;
        lVar28 = lVar28 + 1;
      } while (lVar33 != lVar28);
    }
  }
  uVar2 = *storage_ix;
  uVar30 = uVar2 + 1;
  *(ulong *)(storage + (uVar2 >> 3)) =
       (ulong)(uVar29 != 0) << ((byte)uVar2 & 7) | (ulong)storage[uVar2 >> 3];
  *storage_ix = uVar30;
  if (uVar29 != 0) {
    *(ulong *)(storage + (uVar30 >> 3)) =
         (ulong)(uVar32 - 1) << ((byte)uVar30 & 7) | (ulong)storage[uVar30 >> 3];
    *storage_ix = uVar2 + 5;
  }
  BuildAndStoreHuffmanTree
            (histogram,uVar31 + num_clusters,uVar31 + num_clusters,tree,depths,bits,storage_ix,
             storage);
  uVar31 = *storage_ix;
  if (!bVar37) {
    lVar28 = 0;
    do {
      uVar29 = *(uint *)((long)p + lVar28 * 4);
      uVar26 = uVar29 & 0x1ff;
      uVar30 = (ulong)uVar26;
      bVar1 = depths[uVar30];
      *(ulong *)(storage + (uVar31 >> 3)) =
           (ulong)bits[uVar30] << ((byte)uVar31 & 7) | (ulong)storage[uVar31 >> 3];
      uVar31 = bVar1 + uVar31;
      *storage_ix = uVar31;
      if (uVar26 - 1 < uVar32) {
        *(ulong *)(storage + (uVar31 >> 3)) =
             (ulong)(uVar29 >> 9) << ((byte)uVar31 & 7) | (ulong)storage[uVar31 >> 3];
        uVar31 = uVar31 + uVar30;
        *storage_ix = uVar31;
      }
      lVar28 = lVar28 + 1;
    } while (lVar33 != lVar28);
  }
  *(ulong *)(storage + (uVar31 >> 3)) = (ulong)storage[uVar31 >> 3] | 1L << ((byte)uVar31 & 7);
  *storage_ix = uVar31 + 1;
  BrotliFree(m,p);
  return;
code_r0x0012b969:
  *(uint *)((long)p + lVar33 * 4) = ~(-1 << ((byte)uVar31 & 0x1f)) << 9 | uVar32;
  lVar33 = lVar33 + 1;
  uVar34 = (uVar34 - uVar26) + 1;
  uVar2 = uVar30;
  if (uVar34 == 0) goto LAB_0012b919;
  goto LAB_0012b965;
}

Assistant:

static void EncodeContextMap(MemoryManager* m,
                             const uint32_t* context_map,
                             size_t context_map_size,
                             size_t num_clusters,
                             HuffmanTree* tree,
                             size_t* storage_ix, uint8_t* storage) {
  size_t i;
  uint32_t* rle_symbols;
  uint32_t max_run_length_prefix = 6;
  size_t num_rle_symbols = 0;
  uint32_t histogram[BROTLI_MAX_CONTEXT_MAP_SYMBOLS];
  static const uint32_t kSymbolMask = (1u << SYMBOL_BITS) - 1u;
  uint8_t depths[BROTLI_MAX_CONTEXT_MAP_SYMBOLS];
  uint16_t bits[BROTLI_MAX_CONTEXT_MAP_SYMBOLS];

  StoreVarLenUint8(num_clusters - 1, storage_ix, storage);

  if (num_clusters == 1) {
    return;
  }

  rle_symbols = BROTLI_ALLOC(m, uint32_t, context_map_size);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(rle_symbols)) return;
  MoveToFrontTransform(context_map, context_map_size, rle_symbols);
  RunLengthCodeZeros(context_map_size, rle_symbols,
                     &num_rle_symbols, &max_run_length_prefix);
  memset(histogram, 0, sizeof(histogram));
  for (i = 0; i < num_rle_symbols; ++i) {
    ++histogram[rle_symbols[i] & kSymbolMask];
  }
  {
    BROTLI_BOOL use_rle = TO_BROTLI_BOOL(max_run_length_prefix > 0);
    BrotliWriteBits(1, (uint64_t)use_rle, storage_ix, storage);
    if (use_rle) {
      BrotliWriteBits(4, max_run_length_prefix - 1, storage_ix, storage);
    }
  }
  BuildAndStoreHuffmanTree(histogram, num_clusters + max_run_length_prefix,
                           num_clusters + max_run_length_prefix,
                           tree, depths, bits, storage_ix, storage);
  for (i = 0; i < num_rle_symbols; ++i) {
    const uint32_t rle_symbol = rle_symbols[i] & kSymbolMask;
    const uint32_t extra_bits_val = rle_symbols[i] >> SYMBOL_BITS;
    BrotliWriteBits(depths[rle_symbol], bits[rle_symbol], storage_ix, storage);
    if (rle_symbol > 0 && rle_symbol <= max_run_length_prefix) {
      BrotliWriteBits(rle_symbol, extra_bits_val, storage_ix, storage);
    }
  }
  BrotliWriteBits(1, 1, storage_ix, storage);  /* use move-to-front */
  BROTLI_FREE(m, rle_symbols);
}